

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int cmsys::anon_unknown_3::LoadLines
              (char *fileName,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *lines)

{
  FILE *__stream;
  int nRead;
  FILE *file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  char *fileName_local;
  
  __stream = fopen64(fileName,"r");
  if (__stream == (FILE *)0x0) {
    fileName_local._4_4_ = 0;
  }
  else {
    fileName_local._4_4_ = LoadLines((FILE *)__stream,lines);
    fclose(__stream);
  }
  return fileName_local._4_4_;
}

Assistant:

int LoadLines(const char* fileName, std::vector<std::string>& lines)
{
  FILE* file = fopen(fileName, "r");
  if (file == 0) {
    return 0;
  }
  int nRead = LoadLines(file, lines);
  fclose(file);
  return nRead;
}